

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_MD(TT_ExecContext exc,FT_Long *args)

{
  ushort uVar1;
  ushort uVar2;
  FT_Int32 FVar3;
  FT_Int32 FVar4;
  FT_Vector *pFVar5;
  FT_Vector *pFVar6;
  FT_F26Dot6 FVar7;
  FT_Vector vec;
  FT_Vector *vec2_1;
  FT_Vector *vec1_1;
  FT_Vector *vec2;
  FT_Vector *vec1;
  FT_F26Dot6 D;
  FT_UShort L;
  FT_UShort K;
  FT_Long *args_local;
  TT_ExecContext exc_local;
  
  uVar1 = (ushort)args[1];
  uVar2 = (ushort)*args;
  if ((uVar2 < (exc->zp0).n_points) && (uVar1 < (exc->zp1).n_points)) {
    if ((exc->opcode & 1) == 0) {
      if (((exc->GS).gep0 == 0) || ((exc->GS).gep1 == 0)) {
        pFVar5 = (exc->zp0).org + (int)(uint)uVar2;
        pFVar6 = (exc->zp1).org + (int)(uint)uVar1;
        vec1 = (FT_Vector *)(*exc->func_dualproj)(exc,pFVar5->x - pFVar6->x,pFVar5->y - pFVar6->y);
      }
      else {
        pFVar5 = (exc->zp0).orus + (int)(uint)uVar2;
        pFVar6 = (exc->zp1).orus + (int)(uint)uVar1;
        if ((exc->metrics).x_scale == (exc->metrics).y_scale) {
          FVar7 = (*exc->func_dualproj)(exc,pFVar5->x - pFVar6->x,pFVar5->y - pFVar6->y);
          FVar3 = FT_MulFix_x86_64((FT_Int32)FVar7,(FT_Int32)(exc->metrics).x_scale);
          vec1 = (FT_Vector *)(long)FVar3;
        }
        else {
          FVar3 = FT_MulFix_x86_64((int)pFVar5->x - (int)pFVar6->x,(FT_Int32)(exc->metrics).x_scale)
          ;
          FVar4 = FT_MulFix_x86_64((int)pFVar5->y - (int)pFVar6->y,(FT_Int32)(exc->metrics).y_scale)
          ;
          vec1 = (FT_Vector *)(*exc->func_dualproj)(exc,(long)FVar3,(long)FVar4);
        }
      }
    }
    else {
      vec1 = (FT_Vector *)
             (*exc->func_project)
                       (exc,(exc->zp0).cur[(int)(uint)uVar2].x - (exc->zp1).cur[(int)(uint)uVar1].x,
                        (exc->zp0).cur[(int)(uint)uVar2].y - (exc->zp1).cur[(int)(uint)uVar1].y);
    }
  }
  else {
    if (exc->pedantic_hinting != '\0') {
      exc->error = 0x86;
    }
    vec1 = (FT_Vector *)0x0;
  }
  *args = (FT_Long)vec1;
  return;
}

Assistant:

static void
  Ins_MD( TT_ExecContext  exc,
          FT_Long*        args )
  {
    FT_UShort   K, L;
    FT_F26Dot6  D;


    K = (FT_UShort)args[1];
    L = (FT_UShort)args[0];

    if ( BOUNDS( L, exc->zp0.n_points ) ||
         BOUNDS( K, exc->zp1.n_points ) )
    {
      if ( exc->pedantic_hinting )
        exc->error = FT_THROW( Invalid_Reference );
      D = 0;
    }
    else
    {
      if ( exc->opcode & 1 )
        D = PROJECT( exc->zp0.cur + L, exc->zp1.cur + K );
      else
      {
        /* XXX: UNDOCUMENTED: twilight zone special case */

        if ( exc->GS.gep0 == 0 || exc->GS.gep1 == 0 )
        {
          FT_Vector*  vec1 = exc->zp0.org + L;
          FT_Vector*  vec2 = exc->zp1.org + K;


          D = DUALPROJ( vec1, vec2 );
        }
        else
        {
          FT_Vector*  vec1 = exc->zp0.orus + L;
          FT_Vector*  vec2 = exc->zp1.orus + K;


          if ( exc->metrics.x_scale == exc->metrics.y_scale )
          {
            /* this should be faster */
            D = DUALPROJ( vec1, vec2 );
            D = FT_MulFix( D, exc->metrics.x_scale );
          }
          else
          {
            FT_Vector  vec;


            vec.x = FT_MulFix( vec1->x - vec2->x, exc->metrics.x_scale );
            vec.y = FT_MulFix( vec1->y - vec2->y, exc->metrics.y_scale );

            D = FAST_DUALPROJ( &vec );
          }
        }
      }
    }

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
    /* Disable Type 2 Vacuform Rounds - e.g. Arial Narrow */
    if ( SUBPIXEL_HINTING_INFINALITY         &&
         exc->ignore_x_mode                  &&
         ( D < 0 ? NEG_LONG( D ) : D ) == 64 )
      D += 1;
#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */

    args[0] = D;
  }